

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

Type * __thiscall choc::value::Type::operator=(Type *this,Type *other)

{
  deleteAllocatedObjects(this);
  this->mainType = other->mainType;
  allocateCopy(this,other);
  return this;
}

Assistant:

inline Type& Type::operator= (const Type& other)
{
    deleteAllocatedObjects();
    mainType = other.mainType;
    allocateCopy (other);
    return *this;
}